

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedReadsDatastore.cc
# Opt level: O0

unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
* __thiscall
LinkedReadsDatastore::get_tags_kmers
          (LinkedReadsDatastore *this,int k,int min_tag_cov,
          set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *tags,
          ReadSequenceBuffer *blrsg)

{
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __first;
  bool bVar1;
  reference puVar2;
  iterator this_00;
  StreamKmerFactory *this_01;
  reference puVar3;
  difference_type dVar4;
  int in_ECX;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_RSI;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *in_RDI;
  const_iterator in_R8;
  pair<std::__detail::_Node_iterator<unsigned_long,_true,_false>,_bool> pVar5;
  iterator nri;
  iterator ri;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  kset;
  unsigned_long rid;
  iterator __end1_1;
  iterator __begin1_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range1_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> reads;
  uint t;
  iterator __end1;
  iterator __begin1;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *__range1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> read_ids;
  vector<unsigned_long,_std::allocator<unsigned_long>_> all_kmers;
  StreamKmerFactory skf;
  undefined7 in_stack_fffffffffffffc08;
  uint8_t in_stack_fffffffffffffc0f;
  _Node_iterator_base<unsigned_long,_false> in_stack_fffffffffffffc10;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffc18;
  undefined7 in_stack_fffffffffffffc20;
  undefined1 in_stack_fffffffffffffc27;
  char *in_stack_fffffffffffffc28;
  undefined1 *in_stack_fffffffffffffc38;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffc40;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __last;
  undefined8 in_stack_fffffffffffffc70;
  undefined1 in_stack_fffffffffffffc78;
  undefined7 in_stack_fffffffffffffc79;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_370;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_368 [8];
  unsigned_long *local_328;
  unsigned_long *local_320;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_308;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_300;
  unsigned_long *local_2f8;
  unsigned_long *local_2f0;
  unsigned_long *local_2e8;
  unsigned_long *local_2e0;
  undefined1 local_2c0 [28];
  uint local_2a4;
  _Self local_2a0;
  _Self local_298 [2];
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_288 [26];
  int local_18;
  
  __last._M_current = (unsigned_long *)in_RDI;
  local_18 = in_ECX;
  get_tags_kmers::StreamKmerFactory::StreamKmerFactory
            ((StreamKmerFactory *)in_stack_fffffffffffffc10._M_cur,in_stack_fffffffffffffc0f);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x3c2c08);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x3c2c15);
  local_298[0]._M_node =
       (_Base_ptr)
       std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::begin
                 ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                  CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08));
  local_2a0._M_node =
       (_Base_ptr)
       std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                 ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                  CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08));
  while (bVar1 = std::operator!=(local_298,&local_2a0), bVar1) {
    puVar2 = std::_Rb_tree_const_iterator<unsigned_int>::operator*
                       ((_Rb_tree_const_iterator<unsigned_int> *)in_stack_fffffffffffffc10._M_cur);
    local_2a4 = *puVar2;
    get_tag_reads((LinkedReadsDatastore *)
                  CONCAT71(in_stack_fffffffffffffc79,in_stack_fffffffffffffc78),
                  (LinkedTag)((ulong)in_stack_fffffffffffffc70 >> 0x20));
    in_stack_fffffffffffffc40 = local_288;
    local_2e0 = (unsigned_long *)
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08));
    __gnu_cxx::
    __normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>
    ::__normal_iterator<unsigned_long*>
              ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                *)in_stack_fffffffffffffc10._M_cur,
               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                *)CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08));
    in_stack_fffffffffffffc38 = local_2c0;
    local_2e8 = (unsigned_long *)
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08));
    local_2f0 = (unsigned_long *)
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08));
    local_2f8 = (unsigned_long *)
                std::vector<unsigned_long,std::allocator<unsigned_long>>::
                insert<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,void>
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_RDI,in_R8,
                           in_RSI,__last);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20));
    std::_Rb_tree_const_iterator<unsigned_int>::operator++
              ((_Rb_tree_const_iterator<unsigned_int> *)in_stack_fffffffffffffc10._M_cur);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_288);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            (in_stack_fffffffffffffc40,(size_type)in_stack_fffffffffffffc38);
  local_300 = local_288;
  local_308._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                  CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08));
  this_00 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08));
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                             *)in_stack_fffffffffffffc10._M_cur,
                            (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                             *)CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08)), bVar1
        ) {
    puVar3 = __gnu_cxx::
             __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(&local_308);
    this_01 = (StreamKmerFactory *)
              ReadSequenceBuffer::get_read_sequence
                        ((ReadSequenceBuffer *)this_00._M_current,*puVar3);
    get_tags_kmers(int,int,std::set<unsigned_int,std::less<unsigned_int>,std::
    allocator<unsigned_int>>,ReadSequenceBuffer&)::StreamKmerFactory::
    produce_all_kmers(char_const*,std::vector<unsigned_long,std::allocator<unsigned_long>_>__
              (this_01,in_stack_fffffffffffffc28,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20));
    __gnu_cxx::
    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&local_308);
  }
  local_320 = (unsigned_long *)
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08));
  local_328 = (unsigned_long *)
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08));
  __first._M_current._7_1_ = in_stack_fffffffffffffc27;
  __first._M_current._0_7_ = in_stack_fffffffffffffc20;
  std::
  sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            (__first,in_stack_fffffffffffffc18);
  std::
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  ::unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                   *)0x3c2eca);
  local_368[0]._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                  CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08));
  local_370._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                  CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08));
  while( true ) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08));
    bVar1 = __gnu_cxx::operator<
                      ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)in_stack_fffffffffffffc10._M_cur,
                       (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08));
    if (!bVar1) break;
    while( true ) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08));
      bVar1 = __gnu_cxx::operator<
                        ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)in_stack_fffffffffffffc10._M_cur,
                         (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08));
      in_stack_fffffffffffffc27 = false;
      if (bVar1) {
        puVar3 = __gnu_cxx::
                 __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ::operator*(&local_370);
        in_stack_fffffffffffffc18._M_current = (unsigned_long *)*puVar3;
        puVar3 = __gnu_cxx::
                 __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ::operator*(local_368);
        in_stack_fffffffffffffc27 = in_stack_fffffffffffffc18._M_current == (unsigned_long *)*puVar3
        ;
      }
      if ((bool)in_stack_fffffffffffffc27 == false) break;
      __gnu_cxx::
      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&local_370);
    }
    dVar4 = __gnu_cxx::operator-
                      ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)in_stack_fffffffffffffc10._M_cur,
                       (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08));
    if (local_18 <= dVar4) {
      __gnu_cxx::
      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator*(local_368);
      pVar5 = std::
              unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
              ::insert((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                        *)CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20),
                       in_stack_fffffffffffffc18._M_current);
      in_stack_fffffffffffffc10._M_cur =
           (__node_type *)pVar5.first.super__Node_iterator_base<unsigned_long,_false>._M_cur;
      in_stack_fffffffffffffc0f = pVar5.second;
    }
    local_368[0]._M_current = local_370._M_current;
  }
  std::
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  ::unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                   *)in_stack_fffffffffffffc10._M_cur,
                  (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                   *)CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08));
  std::
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                    *)0x3c305e);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20));
  return (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
          *)__last._M_current;
}

Assistant:

std::unordered_set<uint64_t> LinkedReadsDatastore::get_tags_kmers(int k, int min_tag_cov, std::set<LinkedTag> tags, ReadSequenceBuffer & blrsg) {
    class StreamKmerFactory : public  KMerFactory {
    public:
        explicit StreamKmerFactory(uint8_t k) : KMerFactory(k){}
        inline void produce_all_kmers(const char * seq, std::vector<uint64_t> &mers){
            // TODO: Adjust for when K is larger than what fits in uint64_t!
            last_unknown=0;
            fkmer=0;
            rkmer=0;
            auto s=seq;
            while (*s!='\0' and *s!='\n') {
                //fkmer: grows from the right (LSB)
                //rkmer: grows from the left (MSB)
                fillKBuf(*s, fkmer, rkmer, last_unknown);
                if (last_unknown >= K) {
                    if (fkmer <= rkmer) {
                        // Is fwd
                        mers.emplace_back(fkmer);
                    } else {
                        // Is bwd
                        mers.emplace_back(rkmer);
                    }
                }
                ++s;
            }
        }
    };
    StreamKmerFactory skf(k);

    //reserve space by counting reads first, save only the integer, do not merge just count and insert in the set
    std::vector<uint64_t> all_kmers;
    std::vector<uint64_t> read_ids;
    for (auto t:tags) {
        auto reads=get_tag_reads(t);
        read_ids.insert(read_ids.end(),reads.begin(),reads.end());
    }
    all_kmers.reserve(read_ids.size()*(readsize-k+1));
    for (auto rid:read_ids){
            skf.produce_all_kmers(blrsg.get_read_sequence(rid),all_kmers);
    }
    std::sort(all_kmers.begin(),all_kmers.end());
    std::unordered_set<uint64_t> kset;
    auto ri=all_kmers.begin();
    auto nri=all_kmers.begin();
    while (ri<all_kmers.end()){
        while (nri<all_kmers.end() and *nri==*ri) ++nri;
        if (nri-ri>=min_tag_cov) kset.insert(*ri);
        ri=nri;
    }
    return std::move(kset);
}